

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O3

vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct>::
ConvertToStruct(vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct> *this)

{
  pointer pDVar1;
  pointer this_00;
  DecodePsbtOutputStruct data;
  DecodePsbtOutputStruct local_1a0;
  
  (__return_storage_ptr__->
  super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_JsonVector<cfd::api::json::DecodePsbtOutput>).
            super_vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
            .
            super__Vector_base<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->super_JsonVector<cfd::api::json::DecodePsbtOutput>).
           super_vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
           .
           super__Vector_base<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pDVar1) {
    do {
      api::json::DecodePsbtOutput::ConvertToStruct(&local_1a0,this_00);
      std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>::push_back
                (__return_storage_ptr__,&local_1a0);
      DecodePsbtOutputStruct::~DecodePsbtOutputStruct(&local_1a0);
      this_00 = this_00 + 1;
    } while (this_00 != pDVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }